

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O2

size_t fs_get_homedir(char *path,size_t buffer_size)

{
  size_type sVar1;
  string_view s;
  char *local_38;
  size_t local_30;
  
  fs_get_homedir_abi_cxx11_();
  s._M_str = local_38;
  s._M_len = local_30;
  sVar1 = fs_str2char(s,path,buffer_size);
  std::__cxx11::string::~string((string *)&local_38);
  return sVar1;
}

Assistant:

size_t fs_get_homedir(char* path, const size_t buffer_size)
{
  return fs_str2char(fs_get_homedir(), path, buffer_size);
}